

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bounded_utf8_length_sequence.h
# Opt level: O2

uint32_t __thiscall
absl::debugging_internal::BoundedUtf8LengthSequence<256U>::InsertAndReturnSumOfPredecessors
          (BoundedUtf8LengthSequence<256U> *this,uint32_t index,uint32_t utf8_length)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  char cVar9;
  ushort uVar10;
  byte bVar21;
  byte bVar23;
  int iVar12;
  char cVar22;
  char cVar24;
  byte bVar28;
  int iVar25;
  byte bVar26;
  char cVar27;
  char cVar29;
  byte bVar30;
  undefined1 auVar19 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined4 uVar11;
  undefined6 uVar13;
  undefined8 uVar14;
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  undefined1 auVar20 [16];
  undefined1 auVar36 [14];
  undefined1 auVar37 [14];
  undefined1 auVar38 [16];
  undefined1 auVar40 [16];
  
  uVar1 = 0xff;
  if (index < 0xff) {
    uVar1 = index;
  }
  bVar2 = (char)uVar1 * '\x02' & 0x3e;
  uVar4 = -1L << bVar2;
  uVar5 = (ulong)(uVar1 >> 5);
  uVar6 = ~uVar4;
  uVar7 = this->rep_[uVar5] & uVar6;
  uVar8 = uVar7 & 0x2aaaaaaaaaaaaaaa;
  auVar31._0_2_ = (ushort)uVar7 >> 1;
  auVar31._2_2_ = (ushort)(uVar7 >> 0x10) >> 1;
  auVar31._4_2_ = (ushort)(uVar7 >> 0x20) >> 1;
  auVar31._6_2_ = (ushort)(uVar7 >> 0x31);
  auVar31._8_2_ = (ushort)uVar8 >> 1;
  auVar31._10_2_ = (ushort)(uVar8 >> 0x10) >> 1;
  auVar31._12_2_ = (ushort)(uVar8 >> 0x20) >> 1;
  auVar31._14_2_ = (ushort)(uVar8 >> 0x31);
  auVar31 = auVar31 & _DAT_001a9360;
  uVar10 = CONCAT11((char)(uVar7 >> 8) - auVar31[1],(char)uVar7 - auVar31[0]);
  uVar11 = CONCAT13((char)(uVar7 >> 0x18) - auVar31[3],
                    CONCAT12((char)(uVar7 >> 0x10) - auVar31[2],uVar10));
  uVar13 = CONCAT15((char)(uVar7 >> 0x28) - auVar31[5],
                    CONCAT14((char)(uVar7 >> 0x20) - auVar31[4],uVar11));
  uVar14 = CONCAT17((char)(uVar7 >> 0x38) - auVar31[7],
                    CONCAT16((char)(uVar7 >> 0x30) - auVar31[6],uVar13));
  auVar15._0_10_ =
       CONCAT19((char)(uVar8 >> 8) - auVar31[9],CONCAT18((char)uVar8 - auVar31[8],uVar14));
  auVar15[10] = (char)(uVar8 >> 0x10) - auVar31[10];
  auVar15[0xb] = (char)(uVar8 >> 0x18) - auVar31[0xb];
  auVar17[0xc] = (char)(uVar8 >> 0x20) - auVar31[0xc];
  auVar17._0_12_ = auVar15;
  auVar17[0xd] = (char)(uVar8 >> 0x28) - auVar31[0xd];
  auVar33[0xe] = (char)(uVar8 >> 0x30) - auVar31[0xe];
  auVar33._0_14_ = auVar17;
  auVar33[0xf] = (char)(uVar8 >> 0x38) - auVar31[0xf];
  auVar31 = auVar33 & _DAT_001a9370;
  auVar19._0_2_ = uVar10 >> 2;
  auVar19._2_2_ = (ushort)((uint)uVar11 >> 0x12);
  auVar19._4_2_ = (ushort)((uint6)uVar13 >> 0x22);
  auVar19._6_2_ = (ushort)((ulong)uVar14 >> 0x32);
  auVar19._8_2_ = (ushort)((unkuint10)auVar15._0_10_ >> 0x42);
  auVar19._10_2_ = auVar15._10_2_ >> 2;
  auVar19._12_2_ = auVar17._12_2_ >> 2;
  auVar19._14_2_ = auVar33._14_2_ >> 2;
  auVar19 = auVar19 & _DAT_001a9370;
  cVar9 = auVar19[0] + auVar31[0];
  bVar21 = auVar19[1] + auVar31[1];
  uVar10 = CONCAT11(bVar21,cVar9);
  cVar22 = auVar19[2] + auVar31[2];
  bVar23 = auVar19[3] + auVar31[3];
  uVar11 = CONCAT13(bVar23,CONCAT12(cVar22,uVar10));
  cVar24 = auVar19[4] + auVar31[4];
  bVar26 = auVar19[5] + auVar31[5];
  uVar13 = CONCAT15(bVar26,CONCAT14(cVar24,uVar11));
  cVar27 = auVar19[6] + auVar31[6];
  bVar28 = auVar19[7] + auVar31[7];
  uVar14 = CONCAT17(bVar28,CONCAT16(cVar27,uVar13));
  cVar29 = auVar19[8] + auVar31[8];
  bVar30 = auVar19[9] + auVar31[9];
  auVar16._0_10_ = CONCAT19(bVar30,CONCAT18(cVar29,uVar14));
  auVar16[10] = auVar19[10] + auVar31[10];
  auVar16[0xb] = auVar19[0xb] + auVar31[0xb];
  auVar18[0xc] = auVar19[0xc] + auVar31[0xc];
  auVar18._0_12_ = auVar16;
  auVar18[0xd] = auVar19[0xd] + auVar31[0xd];
  auVar20[0xe] = auVar19[0xe] + auVar31[0xe];
  auVar20._0_14_ = auVar18;
  auVar20[0xf] = auVar19[0xf] + auVar31[0xf];
  auVar32[0] = (char)(uVar10 >> 4) + cVar9;
  auVar32[1] = (bVar21 >> 4) + bVar21;
  auVar32[2] = (char)(ushort)((uint)uVar11 >> 0x14) + cVar22;
  auVar32[3] = (bVar23 >> 4) + bVar23;
  auVar32[4] = (char)(ushort)((uint6)uVar13 >> 0x24) + cVar24;
  auVar32[5] = (bVar26 >> 4) + bVar26;
  auVar32[6] = (char)(ushort)((ulong)uVar14 >> 0x34) + cVar27;
  auVar32[7] = (bVar28 >> 4) + bVar28;
  auVar32[8] = (char)(ushort)((unkuint10)auVar16._0_10_ >> 0x44) + cVar29;
  auVar32[9] = (bVar30 >> 4) + bVar30;
  auVar32[10] = (char)(auVar16._10_2_ >> 4) + auVar16[10];
  auVar32[0xb] = (auVar16[0xb] >> 4) + auVar16[0xb];
  auVar32[0xc] = (char)(auVar18._12_2_ >> 4) + auVar18[0xc];
  auVar32[0xd] = (auVar18[0xd] >> 4) + auVar18[0xd];
  auVar32[0xe] = (char)(auVar20._14_2_ >> 4) + auVar20[0xe];
  auVar32[0xf] = (auVar20[0xf] >> 4) + auVar20[0xf];
  auVar33 = psadbw(auVar32 & _DAT_001a9380,(undefined1  [16])0x0);
  iVar12 = auVar33._0_4_;
  iVar25 = auVar33._8_4_;
  uVar7 = uVar5;
  while (uVar7 != 0) {
    uVar8 = this->rep_[uVar7 - 1];
    uVar3 = uVar8 & 0xaaaaaaaaaaaaaaaa;
    auVar41._0_2_ = (ushort)uVar8 >> 1;
    auVar41._2_2_ = (ushort)(uVar8 >> 0x10) >> 1;
    auVar41._4_2_ = (ushort)(uVar8 >> 0x20) >> 1;
    auVar41._6_2_ = (ushort)(uVar8 >> 0x31);
    auVar41._8_2_ = (ushort)uVar3 >> 1;
    auVar41._10_2_ = (ushort)(uVar3 >> 0x10) >> 1;
    auVar41._12_2_ = (ushort)(uVar3 >> 0x20) >> 1;
    auVar41._14_2_ = (ushort)(uVar3 >> 0x31);
    auVar41 = auVar41 & _DAT_001a9360;
    uVar10 = CONCAT11((char)(uVar8 >> 8) - auVar41[1],(char)uVar8 - auVar41[0]);
    uVar11 = CONCAT13((char)(uVar8 >> 0x18) - auVar41[3],
                      CONCAT12((char)(uVar8 >> 0x10) - auVar41[2],uVar10));
    uVar13 = CONCAT15((char)(uVar8 >> 0x28) - auVar41[5],
                      CONCAT14((char)(uVar8 >> 0x20) - auVar41[4],uVar11));
    uVar14 = CONCAT17((char)(uVar8 >> 0x38) - auVar41[7],
                      CONCAT16((char)(uVar8 >> 0x30) - auVar41[6],uVar13));
    auVar34._0_10_ =
         CONCAT19((char)(uVar3 >> 8) - auVar41[9],CONCAT18((char)uVar3 - auVar41[8],uVar14));
    auVar34[10] = (char)(uVar3 >> 0x10) - auVar41[10];
    auVar34[0xb] = (char)(uVar3 >> 0x18) - auVar41[0xb];
    auVar36[0xc] = (char)(uVar3 >> 0x20) - auVar41[0xc];
    auVar36._0_12_ = auVar34;
    auVar36[0xd] = (char)(uVar3 >> 0x28) - auVar41[0xd];
    auVar38[0xe] = (char)(uVar3 >> 0x30) - auVar41[0xe];
    auVar38._0_14_ = auVar36;
    auVar38[0xf] = (char)(uVar3 >> 0x38) - auVar41[0xf];
    auVar33 = auVar38 & _DAT_001a9370;
    auVar39._0_2_ = uVar10 >> 2;
    auVar39._2_2_ = (ushort)((uint)uVar11 >> 0x12);
    auVar39._4_2_ = (ushort)((uint6)uVar13 >> 0x22);
    auVar39._6_2_ = (ushort)((ulong)uVar14 >> 0x32);
    auVar39._8_2_ = (ushort)((unkuint10)auVar34._0_10_ >> 0x42);
    auVar39._10_2_ = auVar34._10_2_ >> 2;
    auVar39._12_2_ = auVar36._12_2_ >> 2;
    auVar39._14_2_ = auVar38._14_2_ >> 2;
    auVar39 = auVar39 & _DAT_001a9370;
    cVar9 = auVar39[0] + auVar33[0];
    bVar21 = auVar39[1] + auVar33[1];
    uVar10 = CONCAT11(bVar21,cVar9);
    cVar22 = auVar39[2] + auVar33[2];
    bVar23 = auVar39[3] + auVar33[3];
    uVar11 = CONCAT13(bVar23,CONCAT12(cVar22,uVar10));
    cVar24 = auVar39[4] + auVar33[4];
    bVar26 = auVar39[5] + auVar33[5];
    uVar13 = CONCAT15(bVar26,CONCAT14(cVar24,uVar11));
    cVar27 = auVar39[6] + auVar33[6];
    bVar28 = auVar39[7] + auVar33[7];
    uVar14 = CONCAT17(bVar28,CONCAT16(cVar27,uVar13));
    cVar29 = auVar39[8] + auVar33[8];
    bVar30 = auVar39[9] + auVar33[9];
    auVar35._0_10_ = CONCAT19(bVar30,CONCAT18(cVar29,uVar14));
    auVar35[10] = auVar39[10] + auVar33[10];
    auVar35[0xb] = auVar39[0xb] + auVar33[0xb];
    auVar37[0xc] = auVar39[0xc] + auVar33[0xc];
    auVar37._0_12_ = auVar35;
    auVar37[0xd] = auVar39[0xd] + auVar33[0xd];
    auVar40[0xe] = auVar39[0xe] + auVar33[0xe];
    auVar40._0_14_ = auVar37;
    auVar40[0xf] = auVar39[0xf] + auVar33[0xf];
    auVar42[0] = (char)(uVar10 >> 4) + cVar9;
    auVar42[1] = (bVar21 >> 4) + bVar21;
    auVar42[2] = (char)(ushort)((uint)uVar11 >> 0x14) + cVar22;
    auVar42[3] = (bVar23 >> 4) + bVar23;
    auVar42[4] = (char)(ushort)((uint6)uVar13 >> 0x24) + cVar24;
    auVar42[5] = (bVar26 >> 4) + bVar26;
    auVar42[6] = (char)(ushort)((ulong)uVar14 >> 0x34) + cVar27;
    auVar42[7] = (bVar28 >> 4) + bVar28;
    auVar42[8] = (char)(ushort)((unkuint10)auVar35._0_10_ >> 0x44) + cVar29;
    auVar42[9] = (bVar30 >> 4) + bVar30;
    auVar42[10] = (char)(auVar35._10_2_ >> 4) + auVar35[10];
    auVar42[0xb] = (auVar35[0xb] >> 4) + auVar35[0xb];
    auVar42[0xc] = (char)(auVar37._12_2_ >> 4) + auVar37[0xc];
    auVar42[0xd] = (auVar37[0xd] >> 4) + auVar37[0xd];
    auVar42[0xe] = (char)(auVar40._14_2_ >> 4) + auVar40[0xe];
    auVar42[0xf] = (auVar40[0xf] >> 4) + auVar40[0xf];
    auVar33 = psadbw(auVar42 & _DAT_001a9380,(undefined1  [16])0x0);
    iVar12 = iVar12 + auVar33._0_4_;
    iVar25 = iVar25 + auVar33._8_4_;
    uVar7 = uVar7 - 1;
  }
  uVar7 = 7;
  while (uVar5 < uVar7) {
    this->rep_[uVar7] = this->rep_[uVar7] << 2 | this->rep_[uVar7 - 1 & 0xffffffff] >> 0x3e;
    uVar7 = uVar7 - 1;
  }
  uVar7 = 0;
  if (0xfffffffb < utf8_length - 5) {
    uVar7 = (ulong)(utf8_length - 1);
  }
  this->rep_[uVar5] = (uVar4 & this->rep_[uVar5]) << 2 | uVar7 << bVar2 | uVar6 & this->rep_[uVar5];
  return iVar25 + iVar12 + uVar1;
}

Assistant:

uint32_t InsertAndReturnSumOfPredecessors(
      uint32_t index, uint32_t utf8_length) {
    // The caller shouldn't pass out-of-bounds inputs, but if it does happen,
    // clamp the values and try to continue.  If we're being called from a
    // signal handler, the last thing we want to do is crash.  Emitting
    // malformed UTF-8 is a lesser evil.
    if (index >= max_elements) index = max_elements - 1;
    if (utf8_length == 0 || utf8_length > 4) utf8_length = 1;

    const uint32_t word_index = index/32;
    const uint32_t bit_index = 2 * (index % 32);
    const uint64_t ones_bit = uint64_t{1} << bit_index;

    // Compute the sum of predecessors.
    //   - Each value from 1 to 4 is represented by a bit field with value from
    //     0 to 3, so the desired sum is index plus the sum of the
    //     representations actually stored.
    //   - For each bit field, a set low bit should contribute 1 to the sum, and
    //     a set high bit should contribute 2.
    //   - Another way to say the same thing is that each set bit contributes 1,
    //     and each set high bit contributes an additional 1.
    //   - So the sum we want is index + popcount(everything) + popcount(bits in
    //     odd positions).
    const uint64_t odd_bits_mask = 0xaaaaaaaaaaaaaaaa;
    const uint64_t lower_seminibbles_mask = ones_bit - 1;
    const uint64_t higher_seminibbles_mask = ~lower_seminibbles_mask;
    const uint64_t same_word_bits_below_insertion =
        rep_[word_index] & lower_seminibbles_mask;
    int full_popcount = absl::popcount(same_word_bits_below_insertion);
    int odd_popcount =
        absl::popcount(same_word_bits_below_insertion & odd_bits_mask);
    for (uint32_t j = word_index; j > 0; --j) {
      const uint64_t word_below_insertion = rep_[j - 1];
      full_popcount += absl::popcount(word_below_insertion);
      odd_popcount += absl::popcount(word_below_insertion & odd_bits_mask);
    }
    const uint32_t sum_of_predecessors =
        index + static_cast<uint32_t>(full_popcount + odd_popcount);

    // Now insert utf8_length's representation, shifting successors up one
    // place.
    for (uint32_t j = max_elements/32 - 1; j > word_index; --j) {
      rep_[j] = (rep_[j] << 2) | (rep_[j - 1] >> 62);
    }
    rep_[word_index] =
        (rep_[word_index] & lower_seminibbles_mask) |
        (uint64_t{utf8_length - 1} << bit_index) |
        ((rep_[word_index] & higher_seminibbles_mask) << 2);

    return sum_of_predecessors;
  }